

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ActionMessage.cpp
# Opt level: O0

void __thiscall helics::ActionMessage::ActionMessage(ActionMessage *this,ActionMessage *act)

{
  SmallBuffer *in_RSI;
  SmallBuffer *in_RDI;
  
  *(undefined4 *)(in_RDI->buffer)._M_elems = *(undefined4 *)(in_RSI->buffer)._M_elems;
  *(undefined4 *)((in_RDI->buffer)._M_elems + 4) = *(undefined4 *)((in_RSI->buffer)._M_elems + 4);
  *(undefined4 *)((in_RDI->buffer)._M_elems + 8) = *(undefined4 *)((in_RSI->buffer)._M_elems + 8);
  *(undefined4 *)((in_RDI->buffer)._M_elems + 0xc) =
       *(undefined4 *)((in_RSI->buffer)._M_elems + 0xc);
  *(undefined4 *)((in_RDI->buffer)._M_elems + 0x10) =
       *(undefined4 *)((in_RSI->buffer)._M_elems + 0x10);
  *(undefined4 *)((in_RDI->buffer)._M_elems + 0x14) =
       *(undefined4 *)((in_RSI->buffer)._M_elems + 0x14);
  *(undefined2 *)((in_RDI->buffer)._M_elems + 0x18) =
       *(undefined2 *)((in_RSI->buffer)._M_elems + 0x18);
  *(undefined2 *)((in_RDI->buffer)._M_elems + 0x1a) =
       *(undefined2 *)((in_RSI->buffer)._M_elems + 0x1a);
  *(undefined4 *)((in_RDI->buffer)._M_elems + 0x1c) =
       *(undefined4 *)((in_RSI->buffer)._M_elems + 0x1c);
  *(undefined8 *)((in_RDI->buffer)._M_elems + 0x20) =
       *(undefined8 *)((in_RSI->buffer)._M_elems + 0x20);
  *(undefined8 *)((in_RDI->buffer)._M_elems + 0x28) =
       *(undefined8 *)((in_RSI->buffer)._M_elems + 0x28);
  *(undefined8 *)((in_RDI->buffer)._M_elems + 0x30) =
       *(undefined8 *)((in_RSI->buffer)._M_elems + 0x30);
  *(undefined8 *)((in_RDI->buffer)._M_elems + 0x38) =
       *(undefined8 *)((in_RSI->buffer)._M_elems + 0x38);
  SmallBuffer::SmallBuffer(in_RSI,in_RDI);
  CLI::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_RSI,
           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)in_RDI);
  return;
}

Assistant:

ActionMessage::ActionMessage(ActionMessage&& act) noexcept:
    messageAction(act.messageAction), messageID(act.messageID), source_id(act.source_id),
    source_handle(act.source_handle), dest_id(act.dest_id), dest_handle(act.dest_handle),
    counter(act.counter), flags(act.flags), sequenceID(act.sequenceID), actionTime(act.actionTime),
    Te(act.Te), Tdemin(act.Tdemin), Tso(act.Tso), payload(std::move(act.payload)),
    stringData(std::move(act.stringData))
{
}